

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O1

bool cmFileAPI::ReadQuery
               (string *query,vector<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_> *objects
               )

{
  pointer *ppOVar1;
  int iVar2;
  long lVar3;
  iterator iVar4;
  bool bVar5;
  Object o;
  string verStr;
  string kindName;
  Object local_70;
  long *local_60 [2];
  long local_50 [2];
  long *local_40 [2];
  long local_30 [2];
  
  lVar3 = std::__cxx11::string::find((char)query,0x2d);
  if (lVar3 == -1) {
    return false;
  }
  std::__cxx11::string::substr((ulong)local_40,(ulong)query);
  std::__cxx11::string::substr((ulong)local_60,(ulong)query);
  iVar2 = std::__cxx11::string::compare((char *)local_40);
  if (iVar2 == 0) {
    local_70.Version = 0;
    local_70.Kind = CodeModel;
    iVar2 = std::__cxx11::string::compare((char *)local_60);
    bVar5 = iVar2 == 0;
    if (!bVar5) goto LAB_003b44ca;
    local_70.Version = 2;
    iVar4._M_current =
         (objects->super__Vector_base<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar4._M_current ==
        (objects->super__Vector_base<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_>)._M_impl
        .super__Vector_impl_data._M_end_of_storage) {
      std::vector<cmFileAPI::Object,std::allocator<cmFileAPI::Object>>::
      _M_realloc_insert<cmFileAPI::Object_const&>
                ((vector<cmFileAPI::Object,std::allocator<cmFileAPI::Object>> *)objects,iVar4,
                 &local_70);
      goto LAB_003b44ca;
    }
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)local_40);
    if (iVar2 == 0) {
      local_70.Version = 0;
      local_70.Kind = ConfigureLog;
      iVar2 = std::__cxx11::string::compare((char *)local_60);
      bVar5 = iVar2 == 0;
      if (!bVar5) goto LAB_003b44ca;
      local_70.Version = 1;
      iVar4._M_current =
           (objects->super__Vector_base<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (objects->super__Vector_base<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<cmFileAPI::Object,std::allocator<cmFileAPI::Object>>::
        _M_realloc_insert<cmFileAPI::Object_const&>
                  ((vector<cmFileAPI::Object,std::allocator<cmFileAPI::Object>> *)objects,iVar4,
                   &local_70);
        goto LAB_003b44ca;
      }
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)local_40);
      if (iVar2 == 0) {
        local_70.Version = 0;
        local_70.Kind = Cache;
        iVar2 = std::__cxx11::string::compare((char *)local_60);
        bVar5 = iVar2 == 0;
        if (!bVar5) goto LAB_003b44ca;
        local_70.Version = 2;
        iVar4._M_current =
             (objects->super__Vector_base<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (objects->super__Vector_base<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<cmFileAPI::Object,std::allocator<cmFileAPI::Object>>::
          _M_realloc_insert<cmFileAPI::Object_const&>
                    ((vector<cmFileAPI::Object,std::allocator<cmFileAPI::Object>> *)objects,iVar4,
                     &local_70);
          goto LAB_003b44ca;
        }
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)local_40);
        if (iVar2 == 0) {
          local_70.Version = 0;
          local_70.Kind = CMakeFiles;
          iVar2 = std::__cxx11::string::compare((char *)local_60);
          bVar5 = iVar2 == 0;
          if (!bVar5) goto LAB_003b44ca;
          local_70.Version = 1;
          iVar4._M_current =
               (objects->super__Vector_base<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_>).
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (objects->super__Vector_base<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<cmFileAPI::Object,std::allocator<cmFileAPI::Object>>::
            _M_realloc_insert<cmFileAPI::Object_const&>
                      ((vector<cmFileAPI::Object,std::allocator<cmFileAPI::Object>> *)objects,iVar4,
                       &local_70);
            goto LAB_003b44ca;
          }
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)local_40);
          if (iVar2 != 0) {
            iVar2 = std::__cxx11::string::compare((char *)local_40);
            if (iVar2 == 0) {
              local_70.Version = 0;
              local_70.Kind = InternalTest;
              iVar2 = std::__cxx11::string::compare((char *)local_60);
              if (iVar2 == 0) {
                local_70.Version = 1;
              }
              else {
                iVar2 = std::__cxx11::string::compare((char *)local_60);
                if (iVar2 != 0) goto LAB_003b4323;
                local_70.Version = 2;
              }
              iVar4._M_current =
                   (objects->
                   super__Vector_base<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
              if (iVar4._M_current ==
                  (objects->
                  super__Vector_base<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_>)._M_impl
                  .super__Vector_impl_data._M_end_of_storage) {
                bVar5 = true;
                std::vector<cmFileAPI::Object,std::allocator<cmFileAPI::Object>>::
                _M_realloc_insert<cmFileAPI::Object_const&>
                          ((vector<cmFileAPI::Object,std::allocator<cmFileAPI::Object>> *)objects,
                           iVar4,&local_70);
              }
              else {
                *(ulong *)iVar4._M_current = CONCAT44(local_70._4_4_,local_70.Kind);
                (iVar4._M_current)->Version = local_70.Version;
                ppOVar1 = &(objects->
                           super__Vector_base<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_>
                           )._M_impl.super__Vector_impl_data._M_finish;
                *ppOVar1 = *ppOVar1 + 1;
                bVar5 = true;
              }
            }
            else {
LAB_003b4323:
              bVar5 = false;
            }
            goto LAB_003b44ca;
          }
          local_70.Version = 0;
          local_70.Kind = Toolchains;
          iVar2 = std::__cxx11::string::compare((char *)local_60);
          bVar5 = iVar2 == 0;
          if (!bVar5) goto LAB_003b44ca;
          local_70.Version = 1;
          iVar4._M_current =
               (objects->super__Vector_base<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_>).
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (objects->super__Vector_base<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<cmFileAPI::Object,std::allocator<cmFileAPI::Object>>::
            _M_realloc_insert<cmFileAPI::Object_const&>
                      ((vector<cmFileAPI::Object,std::allocator<cmFileAPI::Object>> *)objects,iVar4,
                       &local_70);
            goto LAB_003b44ca;
          }
        }
      }
    }
  }
  *(ulong *)iVar4._M_current = CONCAT44(local_70._4_4_,local_70.Kind);
  (iVar4._M_current)->Version = local_70.Version;
  ppOVar1 = &(objects->super__Vector_base<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_>).
             _M_impl.super__Vector_impl_data._M_finish;
  *ppOVar1 = *ppOVar1 + 1;
LAB_003b44ca:
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] + 1);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return bVar5;
}

Assistant:

bool cmFileAPI::ReadQuery(std::string const& query,
                          std::vector<Object>& objects)
{
  // Parse the "<kind>-" syntax.
  std::string::size_type sep_pos = query.find('-');
  if (sep_pos == std::string::npos) {
    return false;
  }
  std::string kindName = query.substr(0, sep_pos);
  std::string verStr = query.substr(sep_pos + 1);
  if (kindName == ObjectKindName(ObjectKind::CodeModel)) {
    Object o;
    o.Kind = ObjectKind::CodeModel;
    if (verStr == "v2") {
      o.Version = 2;
    } else {
      return false;
    }
    objects.push_back(o);
    return true;
  }
  if (kindName == ObjectKindName(ObjectKind::ConfigureLog)) {
    Object o;
    o.Kind = ObjectKind::ConfigureLog;
    if (verStr == "v1") {
      o.Version = 1;
    } else {
      return false;
    }
    objects.push_back(o);
    return true;
  }
  if (kindName == ObjectKindName(ObjectKind::Cache)) {
    Object o;
    o.Kind = ObjectKind::Cache;
    if (verStr == "v2") {
      o.Version = 2;
    } else {
      return false;
    }
    objects.push_back(o);
    return true;
  }
  if (kindName == ObjectKindName(ObjectKind::CMakeFiles)) {
    Object o;
    o.Kind = ObjectKind::CMakeFiles;
    if (verStr == "v1") {
      o.Version = 1;
    } else {
      return false;
    }
    objects.push_back(o);
    return true;
  }
  if (kindName == ObjectKindName(ObjectKind::Toolchains)) {
    Object o;
    o.Kind = ObjectKind::Toolchains;
    if (verStr == "v1") {
      o.Version = 1;
    } else {
      return false;
    }
    objects.push_back(o);
    return true;
  }
  if (kindName == ObjectKindName(ObjectKind::InternalTest)) {
    Object o;
    o.Kind = ObjectKind::InternalTest;
    if (verStr == "v1") {
      o.Version = 1;
    } else if (verStr == "v2") {
      o.Version = 2;
    } else {
      return false;
    }
    objects.push_back(o);
    return true;
  }
  return false;
}